

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

void __thiscall soul::StructuralParser::parseStaticAssert(StructuralParser *this)

{
  Allocator *allocator;
  CommaSeparatedList *pCVar1;
  ModuleBase *pMVar2;
  pool_ref<soul::AST::Expression> *in_R8;
  ArrayView<soul::pool_ref<soul::AST::Expression>_> args;
  Context context;
  Context CStack_38;
  pool_ref<soul::AST::StaticAssertion> local_20;
  
  getContext(&CStack_38,this);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::skip(&this->super_SOULTokeniser);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2c8be9);
  pCVar1 = parseCommaSeparatedListOfExpressions(this,false,false);
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x2a19e8);
  pMVar2 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  allocator = (Allocator *)(pCVar1->items).items;
  args.e = in_R8;
  args.s = (pool_ref<soul::AST::Expression> *)
           (&(allocator->pool).pools.
             super__Vector_base<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>,_std::allocator<std::unique_ptr<soul::PoolAllocator::Pool,_std::default_delete<soul::PoolAllocator::Pool>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + (pCVar1->items).numActive);
  local_20.object =
       ASTUtilities::createStaticAssertion
                 ((ASTUtilities *)&CStack_38,(Context *)this->allocator,allocator,args);
  std::
  vector<soul::pool_ref<soul::AST::StaticAssertion>,std::allocator<soul::pool_ref<soul::AST::StaticAssertion>>>
  ::emplace_back<soul::pool_ref<soul::AST::StaticAssertion>>
            ((vector<soul::pool_ref<soul::AST::StaticAssertion>,std::allocator<soul::pool_ref<soul::AST::StaticAssertion>>>
              *)&pMVar2->staticAssertions,&local_20);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&CStack_38);
  return;
}

Assistant:

void parseStaticAssert()
    {
        auto context = getContext();
        skip();
        expect (Operator::openParen);
        auto& args = parseCommaSeparatedListOfExpressions (false, false);
        expect (Operator::semicolon);
        module->staticAssertions.push_back (ASTUtilities::createStaticAssertion (context, allocator, args.items));
    }